

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_is_subset(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r1;
  roaring64_bitmap_t *r2;
  
  r1 = roaring64_bitmap_create();
  r2 = roaring64_bitmap_create();
  _Var1 = roaring64_bitmap_is_subset(r1,r2);
  _assert_true((ulong)_Var1,"roaring64_bitmap_is_subset(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x3a7);
  roaring64_bitmap_add(r1,100000);
  roaring64_bitmap_add(r1,0x186a1);
  roaring64_bitmap_add(r1,200000);
  roaring64_bitmap_add(r1,300000);
  roaring64_bitmap_add(r2,100000);
  roaring64_bitmap_add(r2,0x186a1);
  roaring64_bitmap_add(r2,200000);
  roaring64_bitmap_add(r2,400000);
  _Var1 = roaring64_bitmap_is_subset(r1,r2);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_is_subset(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x3b3);
  _Var1 = roaring64_bitmap_is_subset(r2,r1);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_is_subset(r2, r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x3b4);
  roaring64_bitmap_remove(r1,300000);
  _Var1 = roaring64_bitmap_is_subset(r1,r2);
  _assert_true((ulong)_Var1,"roaring64_bitmap_is_subset(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x3b8);
  _Var1 = roaring64_bitmap_is_subset(r2,r1);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_is_subset(r2, r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x3b9);
  roaring64_bitmap_free(r1);
  roaring64_bitmap_free(r2);
  return;
}

Assistant:

DEFINE_TEST(test_is_subset) {
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    roaring64_bitmap_t* r2 = roaring64_bitmap_create();

    assert_true(roaring64_bitmap_is_subset(r1, r2));

    roaring64_bitmap_add(r1, 100000);
    roaring64_bitmap_add(r1, 100001);
    roaring64_bitmap_add(r1, 200000);
    roaring64_bitmap_add(r1, 300000);

    roaring64_bitmap_add(r2, 100000);
    roaring64_bitmap_add(r2, 100001);
    roaring64_bitmap_add(r2, 200000);
    roaring64_bitmap_add(r2, 400000);

    assert_false(roaring64_bitmap_is_subset(r1, r2));
    assert_false(roaring64_bitmap_is_subset(r2, r1));

    roaring64_bitmap_remove(r1, 300000);

    assert_true(roaring64_bitmap_is_subset(r1, r2));
    assert_false(roaring64_bitmap_is_subset(r2, r1));

    roaring64_bitmap_free(r1);
    roaring64_bitmap_free(r2);
}